

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ASTVisitor.h
# Opt level: O0

Expression * __thiscall
soul::RewritingASTVisitor::visit(RewritingASTVisitor *this,CommaSeparatedList *l)

{
  pool_ref<soul::AST::Expression> *ppVar1;
  pool_ref<soul::AST::Expression> *i;
  pool_ref<soul::AST::Expression> *__end2;
  pool_ref<soul::AST::Expression> *__begin2;
  ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> *__range2;
  CommaSeparatedList *l_local;
  RewritingASTVisitor *this_local;
  
  __end2 = ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::begin(&l->items);
  ppVar1 = ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::end(&l->items);
  for (; __end2 != ppVar1; __end2 = __end2 + 1) {
    replaceExpression(this,__end2);
  }
  return &l->super_Expression;
}

Assistant:

virtual AST::Expression& visit (AST::CommaSeparatedList& l)
    {
        for (auto& i : l.items)
            replaceExpression (i);

        return l;
    }